

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_of_suite.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  
  all_null();
  all_boolean();
  all_integer();
  all_real();
  all_array_boolean();
  all_array_string();
  all_array_wstring();
  all_array_u16string();
  all_array_u32string();
  all_map_boolean();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    all_null();
    all_boolean();
    all_integer();
    all_real();
    all_array_boolean();
    all_array_string();
    all_array_wstring();
    all_array_u16string();
    all_array_u32string();
    all_map_boolean();

    return boost::report_errors();
}